

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

void * trico_open_archive_for_writing(uint64_t initial_buffer_size)

{
  uint64_t uVar1;
  int iVar2;
  trico_archive *arch;
  uint8_t *puVar3;
  
  arch = (trico_archive *)malloc(0x48);
  puVar3 = (uint8_t *)malloc(initial_buffer_size);
  arch->buffer = (uint8_t *)0x0;
  arch->buffer_pointer = (uint8_t *)0x0;
  arch->data = (uint8_t *)0x0;
  arch->data_pointer = (uint8_t *)0x0;
  arch->version = 0;
  arch->next_stream_type = trico_empty;
  arch->buffer_size = 0;
  arch->data_size = 0;
  arch->size_available = 0;
  arch->writable = 0;
  arch->buffer = puVar3;
  if (puVar3 != (uint8_t *)0x0) {
    arch->buffer_pointer = puVar3;
    arch->buffer_size = initial_buffer_size;
    arch->size_available = initial_buffer_size;
    arch->writable = 1;
    iVar2 = buffer_ready_for_writing(arch,8);
    if (iVar2 != 0) {
      puVar3 = arch->buffer_pointer;
      puVar3[0] = 'T';
      puVar3[1] = 'r';
      puVar3[2] = 'c';
      puVar3[3] = 'o';
      arch->buffer_pointer = puVar3 + 4;
      uVar1 = arch->size_available;
      arch->size_available = uVar1 - 4;
      *(uint32_t *)(puVar3 + 4) = arch->version;
      arch->buffer_pointer = puVar3 + 8;
      arch->size_available = uVar1 - 8;
      return arch;
    }
  }
  free(arch);
  return (void *)0x0;
}

Assistant:

void* trico_open_archive_for_writing(uint64_t initial_buffer_size)
  {
  struct trico_archive* arch = (struct trico_archive*)trico_malloc(sizeof(struct trico_archive));
  arch->buffer = NULL;
  arch->buffer_pointer = NULL;
  arch->data = NULL;
  arch->data_pointer = NULL;
  arch->version = 0;
  arch->next_stream_type = trico_empty;
  arch->buffer_size = 0;
  arch->data_size = 0;
  arch->size_available = 0;
  arch->writable = 0;

  arch->buffer = (uint8_t*)trico_malloc(initial_buffer_size);
  if (!arch->buffer)
    {
    trico_free(arch);
    return NULL;
    }
  arch->buffer_pointer = arch->buffer;
  arch->buffer_size = initial_buffer_size;
  arch->size_available = initial_buffer_size;
  arch->writable = 1;
  if (write_header(arch) == 0)
    {
    trico_free(arch);
    return NULL;
    }
  return arch;
  }